

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Granulator.cpp
# Opt level: O2

float __thiscall Granulator::Grain::Scan(Grain *this)

{
  int iVar1;
  int iVar2;
  GranulatorSample *pGVar3;
  float *pfVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pGVar3 = this->sample;
  iVar1 = this->channel;
  pfVar4 = pGVar3->data;
  fVar7 = this->pos;
  fVar9 = (ABS(0.0 - fVar7) + fVar7 + 0.0) * 0.5;
  this->pos = fVar7 + this->speed;
  fVar8 = (1.0 - ABS(fVar9 + fVar9 + -1.0)) * this->shape;
  fVar7 = (float)this->length * fVar9 + this->offset;
  fVar9 = floorf(fVar7);
  iVar5 = (int)fVar9;
  iVar2 = pGVar3->numsamples;
  if ((iVar5 < iVar2) || (fVar10 = 0.0, iVar5 = iVar5 - iVar2, this->wrapping != 0)) {
    fVar10 = ((ABS(fVar8) - ABS(fVar8 + -1.0)) + 1.0) * 0.5;
    iVar6 = iVar5 + 1;
    fVar8 = pfVar4[(long)iVar1 + (long)(pGVar3->numchannels * iVar5)];
    if ((iVar6 < iVar2) || (iVar6 = iVar6 - iVar2, this->wrapping != 0)) {
      fVar10 = fVar10 * ((pfVar4[(long)iVar1 + (long)(iVar6 * pGVar3->numchannels)] - fVar8) *
                         (fVar7 - (float)(int)fVar9) + fVar8);
    }
    else {
      fVar10 = fVar10 * fVar8;
    }
  }
  return fVar10;
}

Assistant:

inline float Scan()
        {
            const float* src = sample->data + channel;
            float p = FastMax(0.0f, pos);
            pos += speed;
            float amp = 1.0f - fabsf(p + p - 1.0f);
            amp = FastClip(amp * shape, 0.0f, 1.0f);
            p = offset + p * length;
            int i = FastFloor(p);
            p -= i;
            if (i >= sample->numsamples)
            {
                if (!wrapping)
                    return 0.0f;
                i -= sample->numsamples;
            }
            float s = src[sample->numchannels * i++];
            if (i >= sample->numsamples)
            {
                if (!wrapping)
                    return s * amp;
                i -= sample->numsamples;
            }
            return amp * (s + (src[sample->numchannels * i] - s) * p);
        }